

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O1

void __thiscall
fasttext::HierarchicalSoftmaxLoss::buildTree
          (HierarchicalSoftmaxLoss *this,vector<long,_std::allocator<long>_> *counts)

{
  vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
  *this_00;
  pointer plVar1;
  pointer pNVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  pointer pNVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int32_t j;
  uint uVar12;
  int32_t mini [2];
  vector<int,_std::allocator<int>_> path;
  vector<bool,_std::allocator<bool>_> local_88;
  int local_5c;
  vector<int,_std::allocator<int>_> local_58;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *local_40;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_38;
  
  this_00 = &this->tree_;
  std::
  vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
  ::resize(this_00,(long)this->osz_ * 2 - 1);
  uVar10 = this->osz_;
  lVar5 = (long)(int)uVar10;
  uVar9 = uVar10 * 2 - 1;
  if (0 < lVar5) {
    pNVar6 = (this_00->
             super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar8 = 1;
    if (1 < (int)uVar9) {
      uVar8 = (ulong)uVar9;
    }
    lVar11 = 0;
    do {
      *(undefined8 *)((long)&pNVar6->parent + lVar11) = 0xffffffffffffffff;
      *(undefined4 *)((long)&pNVar6->right + lVar11) = 0xffffffff;
      *(undefined8 *)((long)&pNVar6->count + lVar11) = 1000000000000000;
      (&pNVar6->binary)[lVar11] = false;
      lVar11 = lVar11 + 0x20;
    } while (uVar8 * 0x20 != lVar11);
  }
  if (0 < (int)uVar10) {
    plVar1 = (counts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pNVar6 = (this_00->
             super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar11 = 0;
    do {
      *(undefined8 *)((long)&pNVar6->count + lVar11 * 4) = *(undefined8 *)((long)plVar1 + lVar11);
      lVar11 = lVar11 + 8;
    } while (lVar5 * 8 - lVar11 != 0);
  }
  if ((int)uVar10 < (int)uVar9) {
    uVar7 = uVar10 - 1;
    pNVar6 = (this_00->
             super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
             )._M_impl.super__Vector_impl_data._M_start;
    do {
      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      pNVar2 = (this_00->
               super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar11 = 0;
      do {
        if (((int)uVar7 < 0) || (pNVar2[(int)uVar10].count <= pNVar2[uVar7].count)) {
          uVar3 = uVar7;
          uVar4 = uVar10 + 1;
          uVar12 = uVar10;
        }
        else {
          uVar3 = uVar7 - 1;
          uVar4 = uVar10;
          uVar12 = uVar7;
        }
        uVar10 = uVar4;
        uVar7 = uVar3;
        *(uint *)((long)&local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                 lVar11 * 4) = uVar12;
        lVar11 = lVar11 + 1;
      } while (lVar11 == 1);
      pNVar6[lVar5].left =
           (int)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p;
      lVar11 = (long)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_;
      pNVar6[lVar5].right =
           local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p._4_4_;
      pNVar6[lVar5].count =
           pNVar6[lVar11].count +
           pNVar6[(int)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p].count;
      pNVar6[(int)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p].parent =
           (int32_t)lVar5;
      pNVar6[lVar11].parent = (int32_t)lVar5;
      pNVar6[lVar11].binary = true;
      lVar5 = lVar5 + 1;
    } while (lVar5 != (int)uVar9);
  }
  if (0 < this->osz_) {
    local_38 = &this->paths_;
    local_40 = &this->codes_;
    lVar5 = 0;
    do {
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (int *)0x0;
      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset = 0;
      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      pNVar6 = (this_00->
               super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (pNVar6[lVar5].parent != -1) {
        pNVar6 = pNVar6 + lVar5;
        lVar11 = lVar5;
        do {
          local_5c = pNVar6->parent - this->osz_;
          if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_58,
                       (iterator)
                       local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_5c);
          }
          else {
            *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = local_5c;
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          std::vector<bool,_std::allocator<bool>_>::push_back
                    (&local_88,
                     (this_00->
                     super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
                     )._M_impl.super__Vector_impl_data._M_start[lVar11].binary);
          pNVar2 = (this_00->
                   super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar11 = (long)pNVar2[lVar11].parent;
          pNVar6 = pNVar2 + lVar11;
        } while (pNVar2[lVar11].parent != -1);
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back(local_38,&local_58);
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::push_back(local_40,&local_88);
      if (local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < this->osz_);
  }
  return;
}

Assistant:

void HierarchicalSoftmaxLoss::buildTree(const std::vector<int64_t>& counts) {
  tree_.resize(2 * osz_ - 1);
  for (int32_t i = 0; i < 2 * osz_ - 1; i++) {
    tree_[i].parent = -1;
    tree_[i].left = -1;
    tree_[i].right = -1;
    tree_[i].count = 1e15;
    tree_[i].binary = false;
  }
  for (int32_t i = 0; i < osz_; i++) {
    tree_[i].count = counts[i];
  }
  int32_t leaf = osz_ - 1;
  int32_t node = osz_;
  for (int32_t i = osz_; i < 2 * osz_ - 1; i++) {
    int32_t mini[2] = {0};
    for (int32_t j = 0; j < 2; j++) {
      if (leaf >= 0 && tree_[leaf].count < tree_[node].count) {
        mini[j] = leaf--;
      } else {
        mini[j] = node++;
      }
    }
    tree_[i].left = mini[0];
    tree_[i].right = mini[1];
    tree_[i].count = tree_[mini[0]].count + tree_[mini[1]].count;
    tree_[mini[0]].parent = i;
    tree_[mini[1]].parent = i;
    tree_[mini[1]].binary = true;
  }
  for (int32_t i = 0; i < osz_; i++) {
    std::vector<int32_t> path;
    std::vector<bool> code;
    int32_t j = i;
    while (tree_[j].parent != -1) {
      path.push_back(tree_[j].parent - osz_);
      code.push_back(tree_[j].binary);
      j = tree_[j].parent;
    }
    paths_.push_back(path);
    codes_.push_back(code);
  }
}